

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O0

BinaryenGlobalRef BinaryenGetGlobalByIndex(BinaryenModuleRef module,BinaryenIndex index)

{
  size_type sVar1;
  const_reference this;
  pointer pGVar2;
  Fatal local_1a8;
  vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
  *local_20;
  vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
  *globals;
  BinaryenModuleRef pMStack_10;
  BinaryenIndex index_local;
  BinaryenModuleRef module_local;
  
  local_20 = &module->globals;
  globals._4_4_ = index;
  pMStack_10 = module;
  sVar1 = std::
          vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
          ::size(local_20);
  if (sVar1 <= globals._4_4_) {
    wasm::Fatal::Fatal(&local_1a8);
    wasm::Fatal::operator<<(&local_1a8,(char (*) [22])"invalid global index.");
    wasm::Fatal::~Fatal(&local_1a8);
  }
  this = std::
         vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
         ::operator[](local_20,(ulong)globals._4_4_);
  pGVar2 = std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::get(this);
  return pGVar2;
}

Assistant:

BinaryenGlobalRef BinaryenGetGlobalByIndex(BinaryenModuleRef module,
                                           BinaryenIndex index) {
  const auto& globals = ((Module*)module)->globals;
  if (globals.size() <= index) {
    Fatal() << "invalid global index.";
  }
  return globals[index].get();
}